

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmTarget::GetIncludeDirectories
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmTarget *this,string *config,string *language)

{
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  string *target;
  char *pcVar4;
  iterator __first;
  iterator __last;
  cmTargetInternals *pcVar5;
  reference in_relative;
  TargetPropertyEntry *this_00;
  bool local_329;
  auto_ptr<cmCompiledGeneratorExpression> local_2d0;
  TargetPropertyEntry *local_2c8;
  cmGeneratorExpression local_2c0;
  cmCompiledGeneratorExpression *local_2b8;
  auto_ptr<cmCompiledGeneratorExpression> local_2b0;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  undefined1 local_278 [8];
  string libDir;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_250;
  const_iterator it;
  LinkImplementation *impl;
  string local_238;
  allocator local_211;
  string local_210;
  undefined1 local_1f0 [8];
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  linkInterfaceIncludeDirectoriesEntries;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  bool local_1b2;
  allocator local_1b1;
  undefined1 local_1b0 [6];
  bool debugIncludes;
  allocator local_189;
  string local_188;
  char *local_168;
  char *debugProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  string local_140;
  undefined1 local_120 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  undefined1 local_58 [8];
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  uniqueIncludes;
  string *language_local;
  string *config_local;
  cmTarget *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includes;
  
  uniqueIncludes._M_ht._M_num_elements._7_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  cmsys::
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hash_set((hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
              *)local_58);
  target = GetName_abi_cxx11_(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,"INCLUDE_DIRECTORIES",
             (allocator *)
             ((long)&debugProperties.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_120,target,&local_140,
             (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&debugProperties.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&debugProp);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"CMAKE_DEBUG_TARGET_PROPERTIES",&local_189);
  pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  local_168 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_1b0,pcVar4,&local_1b1);
    cmSystemTools::ExpandListArgument
              ((string *)local_1b0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&debugProp,false);
    std::__cxx11::string::~string((string *)local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  }
  local_329 = false;
  if ((this->DebugIncludesDone & 1U) == 0) {
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&debugProp);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&debugProp);
    local_1c0 = std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[20]>
                          (__first._M_current,__last._M_current,(char (*) [20])0xa63a65);
    linkInterfaceIncludeDirectoriesEntries.
    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&debugProp);
    local_329 = __gnu_cxx::operator!=
                          (&local_1c0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&linkInterfaceIncludeDirectoriesEntries.
                               super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  local_1b2 = local_329;
  bVar2 = cmMakefile::IsConfigured(this->Makefile);
  if (bVar2) {
    this->DebugIncludesDone = true;
  }
  pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
  processIncludeDirectories
            (this,&pcVar5->IncludeDirectoriesEntries,__return_storage_ptr__,
             (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
              *)local_58,(cmGeneratorExpressionDAGChecker *)local_120,config,(bool)(local_1b2 & 1),
             language);
  std::
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ::vector((vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            *)local_1f0);
  pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"INTERFACE_INCLUDE_DIRECTORIES",&local_211);
  cmTargetInternals::AddInterfaceEntries
            (pcVar5,this,config,&local_210,
             (vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              *)local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"APPLE",(allocator *)((long)&impl + 7));
  bVar2 = cmMakefile::IsOn(pcVar1,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)((long)&impl + 7));
  if (bVar2) {
    it._M_current = (cmLinkImplItem *)GetLinkImplementation(this,config);
    local_250._M_current =
         (cmLinkImplItem *)
         std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                   ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)it._M_current);
    while( true ) {
      libDir.field_2._8_8_ =
           std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                     ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)it._M_current);
      bVar2 = __gnu_cxx::operator!=
                        (&local_250,
                         (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                          *)((long)&libDir.field_2 + 8));
      if (!bVar2) break;
      in_relative = __gnu_cxx::
                    __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                    ::operator*(&local_250);
      cmsys::SystemTools::CollapseFullPath((string *)local_278,(string *)in_relative);
      if ((GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)::
           frameworkCheck == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                                       ::frameworkCheck), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&GetIncludeDirectories::frameworkCheck,
                   "(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                     &GetIncludeDirectories::frameworkCheck,&__dso_handle);
        __cxa_guard_release(&GetIncludeDirectories(std::__cxx11::string_const&,std::__cxx11::string_const&)
                             ::frameworkCheck);
      }
      bVar2 = cmsys::RegularExpression::find
                        (&GetIncludeDirectories::frameworkCheck,(string *)local_278);
      if (bVar2) {
        cmsys::RegularExpression::match_abi_cxx11_
                  ((string *)&ge,&GetIncludeDirectories::frameworkCheck,1);
        std::__cxx11::string::operator=((string *)local_278,(string *)&ge);
        std::__cxx11::string::~string((string *)&ge);
        cmGeneratorExpression::cmGeneratorExpression
                  ((cmGeneratorExpression *)&cge,(cmListFileBacktrace *)0x0);
        std::__cxx11::string::c_str();
        cmGeneratorExpression::Parse(&local_2c0,(char *)&cge);
        local_2b8 = (cmCompiledGeneratorExpression *)
                    cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_2c0);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                  (&local_2b0,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_2b8);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)&local_2c0);
        this_00 = (TargetPropertyEntry *)operator_new(0x10);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_2d0,&local_2b0);
        cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
                  (this_00,&local_2d0,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
        local_2c8 = this_00;
        std::
        vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ::push_back((vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                     *)local_1f0,&local_2c8);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_2d0);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_2b0);
        cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
      }
      std::__cxx11::string::~string((string *)local_278);
      __gnu_cxx::
      __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
      ::operator++(&local_250);
    }
  }
  processIncludeDirectories
            (this,(vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                   *)local_1f0,__return_storage_ptr__,
             (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
              *)local_58,(cmGeneratorExpressionDAGChecker *)local_120,config,(bool)(local_1b2 & 1),
             language);
  deleteAndClear((vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                  *)local_1f0);
  uniqueIncludes._M_ht._M_num_elements._7_1_ = 1;
  std::
  vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
  ::~vector((vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
             *)local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&debugProp);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_120);
  cmsys::
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::~hash_set((hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *)local_58);
  if ((uniqueIncludes._M_ht._M_num_elements._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>
cmTarget::GetIncludeDirectories(const std::string& config,
                                const std::string& language) const
{
  std::vector<std::string> includes;
  UNORDERED_SET<std::string> uniqueIncludes;

  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(),
                                             "INCLUDE_DIRECTORIES", 0, 0);

  std::vector<std::string> debugProperties;
  const char *debugProp =
              this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp)
    {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
    }

  bool debugIncludes = !this->DebugIncludesDone
                    && std::find(debugProperties.begin(),
                                 debugProperties.end(),
                                 "INCLUDE_DIRECTORIES")
                        != debugProperties.end();

  if (this->Makefile->IsConfigured())
    {
    this->DebugIncludesDone = true;
    }

  processIncludeDirectories(this,
                            this->Internal->IncludeDirectoriesEntries,
                            includes,
                            uniqueIncludes,
                            &dagChecker,
                            config,
                            debugIncludes,
                            language);

  std::vector<cmTargetInternals::TargetPropertyEntry*>
    linkInterfaceIncludeDirectoriesEntries;
  this->Internal->AddInterfaceEntries(
    this, config, "INTERFACE_INCLUDE_DIRECTORIES",
    linkInterfaceIncludeDirectoriesEntries);

  if(this->Makefile->IsOn("APPLE"))
    {
    LinkImplementation const* impl = this->GetLinkImplementation(config);
    for(std::vector<cmLinkImplItem>::const_iterator
        it = impl->Libraries.begin();
        it != impl->Libraries.end(); ++it)
      {
      std::string libDir = cmSystemTools::CollapseFullPath(*it);

      static cmsys::RegularExpression
        frameworkCheck("(.*\\.framework)(/Versions/[^/]+)?/[^/]+$");
      if(!frameworkCheck.find(libDir))
        {
        continue;
        }

      libDir = frameworkCheck.match(1);

      cmGeneratorExpression ge;
      cmsys::auto_ptr<cmCompiledGeneratorExpression> cge =
                ge.Parse(libDir.c_str());
      linkInterfaceIncludeDirectoriesEntries
              .push_back(new cmTargetInternals::TargetPropertyEntry(cge));
      }
    }

  processIncludeDirectories(this,
                            linkInterfaceIncludeDirectoriesEntries,
                            includes,
                            uniqueIncludes,
                            &dagChecker,
                            config,
                            debugIncludes,
                            language);

  deleteAndClear(linkInterfaceIncludeDirectoriesEntries);

  return includes;
}